

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_failures.c
# Opt level: O3

void test_write_disk_failures(void)

{
  int iVar1;
  archive_entry *entry;
  archive *_a;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_failures.c"
                  ,L'%',L'\x12');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_failures.c"
                     ,L'(',"dir",L'ŭ');
  iVar1 = open("dir/testfile",0x41,0x1ff);
  if (-1 < iVar1) {
    close(iVar1);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_failures.c"
                   ,L'/');
    test_skipping("Can\'t test writing to non-writable directory");
    return;
  }
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_failures.c"
                   ,L'4',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname(entry,"dir/file");
  archive_entry_set_mode(entry,0x81ed);
  archive_entry_set_size(entry,8);
  _a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_failures.c"
                   ,L'8',(uint)(_a != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  archive_write_disk_set_options(_a,L'\x04');
  archive_entry_set_mtime(entry,0x75bcd15,0);
  iVar1 = archive_write_header(_a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_failures.c"
                      ,L';',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",_a);
  iVar1 = archive_write_finish_entry(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_failures.c"
                      ,L'<',0,"0",(long)iVar1,"archive_write_finish_entry(a)",_a);
  iVar1 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_failures.c"
                      ,L'=',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  archive_entry_free(entry);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_failures)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("archive_write_disk interface");
#else
	struct archive_entry *ae;
	struct archive *a;
	int fd;

	/* Force the umask to something predictable. */
	assertUmask(022);

	/* A directory that we can't write to. */
	assertMakeDir("dir", 0555);

	/* Can we? */
	fd = open("dir/testfile", O_WRONLY | O_CREAT | O_BINARY, 0777);
	if (fd >= 0) {
	  /* Apparently, we can, so the test below won't work. */
	  close(fd);
	  skipping("Can't test writing to non-writable directory");
	  return;
	}

	/* Try to extract a regular file into the directory above. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir/file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assert((a = archive_write_disk_new()) != NULL);
        archive_write_disk_set_options(a, ARCHIVE_EXTRACT_TIME);
	archive_entry_set_mtime(ae, 123456789, 0);
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	assertEqualIntA(a, 0, archive_write_finish_entry(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	archive_entry_free(ae);
#endif
}